

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

void __thiscall gl4cts::TextureBarrierBasicOutline::deinit(TextureBarrierBasicOutline *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_1c;
  GLuint i;
  Functions *gl;
  TextureBarrierBasicOutline *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureBarrierBaseTest).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 8))(0x84c0);
  (**(code **)(lVar3 + 0x480))(8,this->m_tex);
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    if (this->m_reference[local_1c] != (GLuint *)0x0) {
      if (this->m_reference[local_1c] != (GLuint *)0x0) {
        operator_delete__(this->m_reference[local_1c]);
      }
      this->m_reference[local_1c] = (GLuint *)0x0;
    }
  }
  if (this->m_actual != (GLuint *)0x0) {
    if (this->m_actual != (GLuint *)0x0) {
      operator_delete__(this->m_actual);
    }
    this->m_actual = (GLuint *)0x0;
  }
  (**(code **)(lVar3 + 0x78))(0x8d40,0);
  (**(code **)(lVar3 + 0x440))(1,&this->m_fbo);
  (**(code **)(lVar3 + 0x40))(0x8892,0);
  (**(code **)(lVar3 + 0xd8))(0);
  (**(code **)(lVar3 + 0x438))(1,&this->m_vbo);
  (**(code **)(lVar3 + 0x490))(1,&this->m_vao);
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  (**(code **)(lVar3 + 0xff0))(0xcf5,4);
  return;
}

Assistant:

virtual void deinit()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// Cleanup textures
		gl.activeTexture(GL_TEXTURE0);
		gl.deleteTextures(NUM_TEXTURES, m_tex);
		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			if (DE_NULL != m_reference[i])
			{
				delete[] m_reference[i];
				m_reference[i] = DE_NULL;
			}
		}

		if (DE_NULL != m_actual)
		{
			delete[] m_actual;
			m_actual = DE_NULL;
		}

		// Cleanup framebuffer
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		gl.deleteFramebuffers(1, &m_fbo);

		// Cleanup vertex array and buffer
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteBuffers(1, &m_vbo);
		gl.deleteVertexArrays(1, &m_vao);

		// Cleanup state
		gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
		gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);
	}